

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::set_allocated_tuple
          (Value_ImmediateValue *this,TupleValue *tuple)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (tuple != (TupleValue *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(tuple->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      tuple = (TupleValue *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (message_arena,&tuple->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 2;
    (this->value_).tuple_ = tuple;
  }
  return;
}

Assistant:

void Value_ImmediateValue::set_allocated_tuple(::CoreML::Specification::MILSpec::TupleValue* tuple) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (tuple) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TupleValue>::GetOwningArena(tuple);
    if (message_arena != submessage_arena) {
      tuple = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, tuple, submessage_arena);
    }
    set_has_tuple();
    value_.tuple_ = tuple;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.Value.ImmediateValue.tuple)
}